

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
::TPZFrontMatrix(TPZFrontMatrix<std::complex<long_double>,_TPZStackEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
                 *this)

{
  TPZRegisterClassId *in_RDI;
  TPZRegisterClassId *this_00;
  TPZVec<int> *this_01;
  void **in_stack_ffffffffffffffb8;
  TPZAbstractFrontMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffd8;
  TPZVec<int> *in_stack_ffffffffffffffe0;
  
  TPZRegisterClassId::
  TPZRegisterClassId<TPZFrontMatrix<std::complex<long_double>,TPZStackEqnStorage<std::complex<long_double>>,TPZFrontSym<std::complex<long_double>>>>
            (in_RDI,0x21);
  TPZAbstractFrontMatrix<std::complex<long_double>_>::TPZAbstractFrontMatrix
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(undefined ***)in_RDI = &PTR__TPZFrontMatrix_02545950;
  TPZStackEqnStorage<std::complex<long_double>_>::TPZStackEqnStorage
            ((TPZStackEqnStorage<std::complex<long_double>_> *)(in_RDI + 0x20));
  this_00 = in_RDI + 0x5a410;
  TPZFrontSym<std::complex<long_double>_>::TPZFrontSym
            ((TPZFrontSym<std::complex<long_double>_> *)this_00);
  this_01 = (TPZVec<int> *)(in_RDI + 0x5a548);
  TPZVec<int>::TPZVec(this_01);
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x5a568));
  TPZFrontSym<std::complex<long_double>_>::Reset
            ((TPZFrontSym<std::complex<long_double>_> *)this_00,(int64_t)this_01);
  TPZStackEqnStorage<std::complex<long_double>_>::Reset
            ((TPZStackEqnStorage<std::complex<long_double>_> *)0x1cff579);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  TPZVec<int>::Resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined8 *)(in_RDI + 0x5a540) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 0x5a538) = 0;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix() : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>()
{
	fFront.Reset();
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=0;
}